

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bufref.c
# Opt level: O0

CURLcode Curl_bufref_memdup(bufref *br,void *ptr,size_t len)

{
  void *local_30;
  uchar *cpy;
  size_t len_local;
  void *ptr_local;
  bufref *br_local;
  
  local_30 = (void *)0x0;
  if (ptr != (void *)0x0) {
    local_30 = (*Curl_cmalloc)(len + 1);
    if (local_30 == (void *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    if (len != 0) {
      memcpy(local_30,ptr,len);
    }
    *(undefined1 *)((long)local_30 + len) = 0;
  }
  Curl_bufref_set(br,local_30,len,curl_free);
  return CURLE_OK;
}

Assistant:

CURLcode Curl_bufref_memdup(struct bufref *br, const void *ptr, size_t len)
{
  unsigned char *cpy = NULL;

  DEBUGASSERT(br);
  DEBUGASSERT(br->signature == SIGNATURE);
  DEBUGASSERT(br->ptr || !br->len);
  DEBUGASSERT(ptr || !len);
  DEBUGASSERT(len <= CURL_MAX_INPUT_LENGTH);

  if(ptr) {
    cpy = malloc(len + 1);
    if(!cpy)
      return CURLE_OUT_OF_MEMORY;
    if(len)
      memcpy(cpy, ptr, len);
    cpy[len] = '\0';
  }

  Curl_bufref_set(br, cpy, len, curl_free);
  return CURLE_OK;
}